

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Options * leveldb::SanitizeOptions
                    (string *dbname,InternalKeyComparator *icmp,InternalFilterPolicy *ipolicy,
                    Options *src)

{
  long *plVar1;
  bool bVar2;
  Cache *pCVar3;
  FilterPolicy *in_RCX;
  Comparator *in_RDX;
  undefined8 in_RSI;
  Options *in_RDI;
  void *in_R8;
  long in_FS_OFFSET;
  Options *result;
  Status s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 *in_stack_ffffffffffffff28;
  FilterPolicy *local_c8;
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(in_RDI,in_R8,0x60);
  in_RDI->comparator = in_RDX;
  local_c8 = in_RCX;
  if (*(long *)((long)in_R8 + 0x58) == 0) {
    local_c8 = (FilterPolicy *)0x0;
  }
  in_RDI->filter_policy = local_c8;
  ClipToRange<int,int>((int *)in_stack_ffffffffffffff08,0,0xd0cadb);
  ClipToRange<unsigned_long,int>((unsigned_long *)in_stack_ffffffffffffff08,0,0xd0caf3);
  ClipToRange<unsigned_long,int>((unsigned_long *)in_stack_ffffffffffffff08,0,0xd0cb0b);
  ClipToRange<unsigned_long,int>((unsigned_long *)in_stack_ffffffffffffff08,0,0xd0cb23);
  if (in_RDI->info_log == (Logger *)0x0) {
    in_stack_ffffffffffffff28 = local_70;
    (**(code **)(**(long **)((long)in_R8 + 0x10) + 0x48))
              (in_stack_ffffffffffffff28,*(long **)((long)in_R8 + 0x10),in_RSI);
    Status::~Status((Status *)in_stack_ffffffffffffff08);
    plVar1 = *(long **)((long)in_R8 + 0x10);
    InfoLogFileName((string *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    OldInfoLogFileName((string *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    (**(code **)(*plVar1 + 0x60))(local_78,plVar1,local_28,local_48);
    Status::~Status((Status *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(in_stack_ffffffffffffff08);
    plVar1 = *(long **)((long)in_R8 + 0x10);
    InfoLogFileName((string *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    (**(code **)(*plVar1 + 0x90))(local_80,plVar1,local_68,&in_RDI->info_log);
    std::__cxx11::string::~string(in_stack_ffffffffffffff08);
    bVar2 = Status::ok((Status *)in_stack_ffffffffffffff08);
    if (!bVar2) {
      in_RDI->info_log = (Logger *)0x0;
    }
    Status::~Status((Status *)in_stack_ffffffffffffff08);
  }
  if (in_RDI->block_cache == (Cache *)0x0) {
    pCVar3 = NewLRUCache((size_t)in_stack_ffffffffffffff28);
    in_RDI->block_cache = pCVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

Options SanitizeOptions(const std::string& dbname,
                        const InternalKeyComparator* icmp,
                        const InternalFilterPolicy* ipolicy,
                        const Options& src) {
  Options result = src;
  result.comparator = icmp;
  result.filter_policy = (src.filter_policy != nullptr) ? ipolicy : nullptr;
  ClipToRange(&result.max_open_files, 64 + kNumNonTableCacheFiles, 50000);
  ClipToRange(&result.write_buffer_size, 64 << 10, 1 << 30);
  ClipToRange(&result.max_file_size, 1 << 20, 1 << 30);
  ClipToRange(&result.block_size, 1 << 10, 4 << 20);
  if (result.info_log == nullptr) {
    // Open a log file in the same directory as the db
    src.env->CreateDir(dbname);  // In case it does not exist
    src.env->RenameFile(InfoLogFileName(dbname), OldInfoLogFileName(dbname));
    Status s = src.env->NewLogger(InfoLogFileName(dbname), &result.info_log);
    if (!s.ok()) {
      // No place suitable for logging
      result.info_log = nullptr;
    }
  }
  if (result.block_cache == nullptr) {
    result.block_cache = NewLRUCache(8 << 20);
  }
  return result;
}